

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringify.c++
# Opt level: O0

Which capnp::anon_unknown_2::whichFieldType(Field *field)

{
  Which WVar1;
  Reader local_a8;
  Reader local_78;
  undefined1 local_48 [8];
  Reader proto;
  Field *field_local;
  
  proto._reader._40_8_ = field;
  StructSchema::Field::getProto((Reader *)local_48,field);
  WVar1 = capnp::schema::Field::Reader::which((Reader *)local_48);
  if (WVar1 == SLOT) {
    capnp::schema::Field::Reader::getSlot(&local_a8,(Reader *)local_48);
    capnp::schema::Field::Slot::Reader::getType(&local_78,&local_a8);
    field_local._6_2_ = capnp::schema::Type::Reader::which(&local_78);
  }
  else {
    if (WVar1 != GROUP) {
      kj::_::unreachable();
    }
    field_local._6_2_ = STRUCT;
  }
  return field_local._6_2_;
}

Assistant:

static schema::Type::Which whichFieldType(const StructSchema::Field& field) {
  auto proto = field.getProto();
  switch (proto.which()) {
    case schema::Field::SLOT:
      return proto.getSlot().getType().which();
    case schema::Field::GROUP:
      return schema::Type::STRUCT;
  }
  KJ_UNREACHABLE;
}